

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O0

double dds_get_bucket_value(dds_bucket_id_mapping *bid_mapping,int bid)

{
  double local_20;
  double value;
  int bid_local;
  dds_bucket_id_mapping *bid_mapping_local;
  
  if (bid_mapping->type == LOG_UPPER) {
    local_20 = exp((double)bid * bid_mapping->log_gamma);
    local_20 = local_20 * (1.0 - bid_mapping->alpha);
  }
  else if (bid_mapping->type == LOG_LOWER) {
    local_20 = exp((double)bid * bid_mapping->log_gamma);
    local_20 = local_20 * (bid_mapping->alpha + 1.0);
  }
  else {
    local_20 = exp((double)bid * bid_mapping->log_gamma);
    local_20 = local_20 * (1.0 - bid_mapping->alpha);
  }
  return local_20;
}

Assistant:

double dds_get_bucket_value(struct dds_bucket_id_mapping *bid_mapping, int bid) {
    double value;
    switch (bid_mapping->type) {
        case LOG_UPPER:
            value = exp(bid * bid_mapping->log_gamma) * (1 - bid_mapping->alpha);
            break;
        case LOG_LOWER:
            value = exp(bid * bid_mapping->log_gamma) * (1 + bid_mapping->alpha);
            break;
        default:
            value = exp(bid * bid_mapping->log_gamma) * (1 - bid_mapping->alpha);
    }

    return value;
}